

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::split_token
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  _Elt_pointer pptVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  compile_error *this_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_01;
  _Elt_pointer pptVar5;
  _Elt_pointer __x;
  allocator local_61;
  _Map_pointer local_60;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_58;
  string local_50;
  
  __x = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  pptVar5 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_last;
  local_60 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pptVar1 = (raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  bVar2 = false;
  local_58 = signals;
  while( true ) {
    if (__x == pptVar1) {
      if (!bVar2) {
        local_50._M_dataplus._M_p = (pointer)0x0;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)objects,
                   (token_base **)&local_50);
      }
      return;
    }
    iVar4 = (*(*__x)->_vptr_token_base[2])();
    if (iVar4 == 2) break;
    iVar4 = (*(*__x)->_vptr_token_base[2])();
    this_01 = objects;
    bVar3 = true;
    if (iVar4 == 3) {
      if (!bVar2) {
        local_50._M_dataplus._M_p = (pointer)0x0;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)objects,
                   (token_base **)&local_50);
      }
      this_01 = local_58;
      bVar3 = false;
    }
    bVar2 = bVar3;
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back(this_01,__x);
    __x = __x + 1;
    if (__x == pptVar5) {
      __x = local_60[1];
      local_60 = local_60 + 1;
      pptVar5 = __x + 0x40;
    }
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_50,"Wrong format of expression.",&local_61);
  compile_error::compile_error(this_00,&local_50);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::split_token(std::deque<token_base *> &raw, std::deque<token_base *> &signals,
	                                std::deque<token_base *> &objects)
	{
		bool request_signal = false;
		for (auto &ptr: raw) {
			if (ptr->get_type() == token_types::action)
				throw compile_error("Wrong format of expression.");
			if (ptr->get_type() == token_types::signal) {
				if (!request_signal)
					objects.push_back(nullptr);
				signals.push_back(ptr);
				request_signal = false;
			}
			else {
				objects.push_back(ptr);
				request_signal = true;
			}
		}
		if (!request_signal)
			objects.push_back(nullptr);
	}